

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

int __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::init(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  byte new_value;
  uchar uVar1;
  value_type vVar2;
  int extraout_EAX;
  reference this_00;
  reference pvVar3;
  reference new_value_00;
  reference pvVar4;
  reference peVar5;
  in_fake_critical_section *this_01;
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *in_RCX;
  inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *in_RDX;
  basic_node_ptr<unodb::detail::node_header> local_70;
  basic_node_ptr<unodb::detail::node_header> local_68;
  key_view local_60;
  element_type local_4b;
  byte local_4a;
  byte local_49;
  uint8_t key_byte;
  byte existing_key_byte;
  pointer pbStack_48;
  uint8_t i;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *child_ptr;
  db_inode_reclaimable_ptr<unodb::detail::inode_16<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  db_leaf_unique_ptr *child_local;
  inode16_type *source_node_local;
  db_type *db_instance_local;
  basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  tree_depth_type depth_local;
  
  basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
  ::
  make_db_inode_reclaimable_ptr<unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
            ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
              *)&child_ptr,in_RDX,(db_type *)ctx);
  pbStack_48 = std::
               unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ::release(in_RCX);
  for (local_49 = 0; local_49 < 0x10; local_49 = local_49 + 1) {
    this_00 = std::array<unodb::in_fake_critical_section<std::byte>,_16UL>::operator[]
                        (&(in_RDX->
                          super_inode_16_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                          ).keys.byte_array,(ulong)local_49);
    local_4a = in_fake_critical_section<std::byte>::load(this_00);
    new_value = local_49;
    pvVar3 = std::array<unodb::in_fake_critical_section<unsigned_char>,_256UL>::operator[]
                       (&this->child_indexes,(ulong)local_4a);
    in_fake_critical_section<unsigned_char>::operator=(pvVar3,new_value);
  }
  for (local_49 = 0; local_49 < 0x10; local_49 = local_49 + 1) {
    new_value_00 = std::
                   array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_16UL>
                   ::operator[](&(in_RDX->
                                 super_inode_16_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                                 ).children,(ulong)local_49);
    pvVar4 = std::
             array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_48UL>
             ::operator[](&(this->children).pointer_array,(ulong)local_49);
    in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::operator=
              (pvVar4,new_value_00);
  }
  local_60 = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
             ::get_key_view(pbStack_48);
  vVar2 = tree_depth::operator_cast_to_unsigned_int((tree_depth *)((long)&this_local + 4));
  peVar5 = std::span<const_std::byte,_18446744073709551615UL>::operator[](&local_60,(ulong)vVar2);
  local_4b = *peVar5;
  this_01 = (in_fake_critical_section *)
            std::array<unodb::in_fake_critical_section<unsigned_char>,_256UL>::operator[]
                      (&this->child_indexes,(ulong)local_4b);
  uVar1 = in_fake_critical_section::operator_cast_to_unsigned_char(this_01);
  if (uVar1 == 0xff) {
    if (local_49 == 0x10) {
      pvVar3 = std::array<unodb::in_fake_critical_section<unsigned_char>,_256UL>::operator[]
                         (&this->child_indexes,(ulong)local_4b);
      in_fake_critical_section<unsigned_char>::operator=(pvVar3,'\x10');
      basic_node_ptr<unodb::detail::node_header>::basic_node_ptr
                (&local_68,(header_type *)pbStack_48,LEAF);
      pvVar4 = std::
               array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_48UL>
               ::operator[](&(this->children).pointer_array,(ulong)local_49);
      in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::
      operator=(pvVar4,local_68);
      for (local_49 = in_fake_critical_section::operator_cast_to_unsigned_char
                                ((in_fake_critical_section *)&this->field_0x8); local_49 < 0x30;
          local_49 = local_49 + 1) {
        basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_70,(nullptr_t)0x0);
        pvVar4 = std::
                 array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_48UL>
                 ::operator[](&(this->children).pointer_array,(ulong)local_49);
        in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::
        operator=(pvVar4,local_70);
      }
      std::
      unique_ptr<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)&child_ptr);
      return extraout_EAX;
    }
    __assert_fail("i == inode16_type::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x86f,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode16_type &__restrict, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  __assert_fail("child_indexes[key_byte] == empty_child",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x86e,
                "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode16_type &__restrict, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
               );
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode16_type &__restrict source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode16_type>(
            &source_node, db_instance)};
    auto *const __restrict child_ptr = child.release();

    // TODO(laurynas): consider AVX512 scatter?
    std::uint8_t i = 0;
    for (; i < inode16_type::capacity; ++i) {
      const auto existing_key_byte = source_node.keys.byte_array[i].load();
      child_indexes[static_cast<std::uint8_t>(existing_key_byte)] = i;
    }
    for (i = 0; i < inode16_type::capacity; ++i) {
      children.pointer_array[i] = source_node.children[i];
    }

    const auto key_byte =
        static_cast<std::uint8_t>(child_ptr->get_key_view()[depth]);

    UNODB_DETAIL_ASSERT(child_indexes[key_byte] == empty_child);
    UNODB_DETAIL_ASSUME(i == inode16_type::capacity);

    child_indexes[key_byte] = i;
    children.pointer_array[i] = node_ptr{child_ptr, node_type::LEAF};
    for (i = this->children_count; i < basic_inode_48::capacity; i++) {
      children.pointer_array[i] = node_ptr{nullptr};
    }
  }